

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O0

void FeatureParameterExtraction(NoiseSuppressionC *self,int flag)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float local_64;
  float local_60;
  float avgHistLrtCompl;
  float avgSquareHistLrt;
  float avgHistLrt;
  float fluctLrt;
  float posPeak2SpecDiff;
  float posPeak1SpecDiff;
  float posPeak2SpecFlat;
  float posPeak1SpecFlat;
  float featureSum;
  float binMid;
  int weightPeak2SpecDiff;
  int weightPeak1SpecDiff;
  int weightPeak2SpecFlat;
  int weightPeak1SpecFlat;
  int maxPeak2;
  int maxPeak1;
  int numHistLrt;
  int useFeatureSpecDiff;
  int useFeatureSpecFlat;
  int i;
  int flag_local;
  NoiseSuppressionC *self_local;
  
  if (flag == 0) {
    if ((self->featureData[3] < (self->featureExtractionParams).binSizeLrt * 1000.0) &&
       (0.0 <= self->featureData[3])) {
      iVar2 = (int)(self->featureData[3] / (self->featureExtractionParams).binSizeLrt);
      self->histLrt[iVar2] = self->histLrt[iVar2] + 1;
    }
    if ((self->featureData[0] < (self->featureExtractionParams).binSizeSpecFlat * 1000.0) &&
       (0.0 <= self->featureData[0])) {
      iVar2 = (int)(self->featureData[0] / (self->featureExtractionParams).binSizeSpecFlat);
      self->histSpecFlat[iVar2] = self->histSpecFlat[iVar2] + 1;
    }
    if ((self->featureData[4] < (self->featureExtractionParams).binSizeSpecDiff * 1000.0) &&
       (0.0 <= self->featureData[4])) {
      iVar2 = (int)(self->featureData[4] / (self->featureExtractionParams).binSizeSpecDiff);
      self->histSpecDiff[iVar2] = self->histSpecDiff[iVar2] + 1;
    }
  }
  if (flag == 1) {
    avgHistLrtCompl = 0.0;
    local_64 = 0.0;
    local_60 = 0.0;
    maxPeak2 = 0;
    for (useFeatureSpecDiff = 0; useFeatureSpecDiff < 1000;
        useFeatureSpecDiff = useFeatureSpecDiff + 1) {
      fVar3 = ((float)useFeatureSpecDiff + 0.5) * (self->featureExtractionParams).binSizeLrt;
      if (fVar3 <= (self->featureExtractionParams).rangeAvgHistLrt) {
        avgHistLrtCompl = (float)self->histLrt[useFeatureSpecDiff] * fVar3 + avgHistLrtCompl;
        maxPeak2 = self->histLrt[useFeatureSpecDiff] + maxPeak2;
      }
      local_60 = (float)self->histLrt[useFeatureSpecDiff] * fVar3 * fVar3 + local_60;
      local_64 = (float)self->histLrt[useFeatureSpecDiff] * fVar3 + local_64;
    }
    if (0 < maxPeak2) {
      avgHistLrtCompl = avgHistLrtCompl / (float)maxPeak2;
    }
    fVar3 = -avgHistLrtCompl * (local_64 / (float)self->modelUpdatePars[1]) +
            local_60 / (float)self->modelUpdatePars[1];
    if ((self->featureExtractionParams).thresFluctLrt <= fVar3) {
      self->priorModelPars[0] = (self->featureExtractionParams).factor1ModelPars * avgHistLrtCompl;
      if (self->priorModelPars[0] < (self->featureExtractionParams).minLrt) {
        self->priorModelPars[0] = (self->featureExtractionParams).minLrt;
      }
      pfVar1 = &(self->featureExtractionParams).maxLrt;
      if (*pfVar1 <= self->priorModelPars[0] && self->priorModelPars[0] != *pfVar1) {
        self->priorModelPars[0] = (self->featureExtractionParams).maxLrt;
      }
    }
    else {
      self->priorModelPars[0] = (self->featureExtractionParams).maxLrt;
    }
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;
    posPeak1SpecDiff = 0.0;
    posPeak2SpecDiff = 0.0;
    weightPeak1SpecDiff = 0;
    weightPeak2SpecDiff = 0;
    for (useFeatureSpecDiff = 0; useFeatureSpecDiff < 1000;
        useFeatureSpecDiff = useFeatureSpecDiff + 1) {
      fVar4 = ((float)useFeatureSpecDiff + 0.5) * (self->featureExtractionParams).binSizeSpecFlat;
      if (weightPeak1SpecFlat < self->histSpecFlat[useFeatureSpecDiff]) {
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        weightPeak2SpecDiff = weightPeak1SpecDiff;
        posPeak2SpecDiff = posPeak1SpecDiff;
        weightPeak1SpecFlat = self->histSpecFlat[useFeatureSpecDiff];
        weightPeak1SpecDiff = self->histSpecFlat[useFeatureSpecDiff];
        posPeak1SpecDiff = fVar4;
      }
      else if (weightPeak2SpecFlat < self->histSpecFlat[useFeatureSpecDiff]) {
        weightPeak2SpecFlat = self->histSpecFlat[useFeatureSpecDiff];
        weightPeak2SpecDiff = self->histSpecFlat[useFeatureSpecDiff];
        posPeak2SpecDiff = fVar4;
      }
    }
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;
    fluctLrt = 0.0;
    avgHistLrt = 0.0;
    binMid = 0.0;
    featureSum = 0.0;
    for (useFeatureSpecDiff = 0; useFeatureSpecDiff < 1000;
        useFeatureSpecDiff = useFeatureSpecDiff + 1) {
      fVar4 = ((float)useFeatureSpecDiff + 0.5) * (self->featureExtractionParams).binSizeSpecDiff;
      if (weightPeak1SpecFlat < self->histSpecDiff[useFeatureSpecDiff]) {
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        featureSum = binMid;
        avgHistLrt = fluctLrt;
        weightPeak1SpecFlat = self->histSpecDiff[useFeatureSpecDiff];
        binMid = (float)self->histSpecDiff[useFeatureSpecDiff];
        fluctLrt = fVar4;
      }
      else if (weightPeak2SpecFlat < self->histSpecDiff[useFeatureSpecDiff]) {
        weightPeak2SpecFlat = self->histSpecDiff[useFeatureSpecDiff];
        featureSum = (float)self->histSpecDiff[useFeatureSpecDiff];
        avgHistLrt = fVar4;
      }
    }
    numHistLrt = 1;
    if ((ABS(posPeak2SpecDiff - posPeak1SpecDiff) <
         (self->featureExtractionParams).limitPeakSpacingSpecFlat) &&
       ((self->featureExtractionParams).limitPeakWeightsSpecFlat * (float)weightPeak1SpecDiff <
        (float)weightPeak2SpecDiff)) {
      weightPeak1SpecDiff = weightPeak2SpecDiff + weightPeak1SpecDiff;
      posPeak1SpecDiff = (posPeak1SpecDiff + posPeak2SpecDiff) * 0.5;
    }
    if ((weightPeak1SpecDiff < (self->featureExtractionParams).thresWeightSpecFlat) ||
       (posPeak1SpecDiff < (self->featureExtractionParams).thresPosSpecFlat)) {
      numHistLrt = 0;
    }
    if (numHistLrt == 1) {
      self->priorModelPars[1] = (self->featureExtractionParams).factor2ModelPars * posPeak1SpecDiff;
      if (self->priorModelPars[1] < (self->featureExtractionParams).minSpecFlat) {
        self->priorModelPars[1] = (self->featureExtractionParams).minSpecFlat;
      }
      pfVar1 = &(self->featureExtractionParams).maxSpecFlat;
      if (*pfVar1 <= self->priorModelPars[1] && self->priorModelPars[1] != *pfVar1) {
        self->priorModelPars[1] = (self->featureExtractionParams).maxSpecFlat;
      }
    }
    if ((ABS(avgHistLrt - fluctLrt) < (self->featureExtractionParams).limitPeakSpacingSpecDiff) &&
       ((self->featureExtractionParams).limitPeakWeightsSpecDiff * (float)(int)binMid <
        (float)(int)featureSum)) {
      binMid = (float)((int)featureSum + (int)binMid);
      fluctLrt = (fluctLrt + avgHistLrt) * 0.5;
    }
    self->priorModelPars[3] = (self->featureExtractionParams).factor1ModelPars * fluctLrt;
    maxPeak1 = (int)((self->featureExtractionParams).thresWeightSpecDiff <= (int)binMid);
    if (self->priorModelPars[3] < (self->featureExtractionParams).minSpecDiff) {
      self->priorModelPars[3] = (self->featureExtractionParams).minSpecDiff;
    }
    pfVar1 = &(self->featureExtractionParams).maxSpecDiff;
    if (*pfVar1 <= self->priorModelPars[3] && self->priorModelPars[3] != *pfVar1) {
      self->priorModelPars[3] = (self->featureExtractionParams).maxSpecDiff;
    }
    if (fVar3 < (self->featureExtractionParams).thresFluctLrt) {
      maxPeak1 = 0;
    }
    fVar3 = (float)(numHistLrt + 1 + maxPeak1);
    self->priorModelPars[4] = 1.0 / fVar3;
    self->priorModelPars[5] = (float)numHistLrt / fVar3;
    self->priorModelPars[6] = (float)maxPeak1 / fVar3;
    if (0 < self->modelUpdatePars[0]) {
      for (useFeatureSpecDiff = 0; useFeatureSpecDiff < 1000;
          useFeatureSpecDiff = useFeatureSpecDiff + 1) {
        self->histLrt[useFeatureSpecDiff] = 0;
        self->histSpecFlat[useFeatureSpecDiff] = 0;
        self->histSpecDiff[useFeatureSpecDiff] = 0;
      }
    }
  }
  return;
}

Assistant:

static void FeatureParameterExtraction(NoiseSuppressionC* self, int flag) {
  int i, useFeatureSpecFlat, useFeatureSpecDiff, numHistLrt;
  int maxPeak1, maxPeak2;
  int weightPeak1SpecFlat, weightPeak2SpecFlat, weightPeak1SpecDiff,
      weightPeak2SpecDiff;

  float binMid, featureSum;
  float posPeak1SpecFlat, posPeak2SpecFlat, posPeak1SpecDiff, posPeak2SpecDiff;
  float fluctLrt, avgHistLrt, avgSquareHistLrt, avgHistLrtCompl;

  // 3 features: LRT, flatness, difference.
  // lrt_feature = self->featureData[3];
  // flat_feature = self->featureData[0];
  // diff_feature = self->featureData[4];

  // Update histograms.
  if (flag == 0) {
    // LRT
    if ((self->featureData[3] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeLrt) &&
        (self->featureData[3] >= 0.0)) {
      i = (int)(self->featureData[3] /
                self->featureExtractionParams.binSizeLrt);
      self->histLrt[i]++;
    }
    // Spectral flatness.
    if ((self->featureData[0] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecFlat) &&
        (self->featureData[0] >= 0.0)) {
      i = (int)(self->featureData[0] /
                self->featureExtractionParams.binSizeSpecFlat);
      self->histSpecFlat[i]++;
    }
    // Spectral difference.
    if ((self->featureData[4] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecDiff) &&
        (self->featureData[4] >= 0.0)) {
      i = (int)(self->featureData[4] /
                self->featureExtractionParams.binSizeSpecDiff);
      self->histSpecDiff[i]++;
    }
  }

  // Extract parameters for speech/noise probability.
  if (flag == 1) {
    // LRT feature: compute the average over
    // self->featureExtractionParams.rangeAvgHistLrt.
    avgHistLrt = 0.0;
    avgHistLrtCompl = 0.0;
    avgSquareHistLrt = 0.0;
    numHistLrt = 0;
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid = ((float)i + 0.5f) * self->featureExtractionParams.binSizeLrt;
      if (binMid <= self->featureExtractionParams.rangeAvgHistLrt) {
        avgHistLrt += self->histLrt[i] * binMid;
        numHistLrt += self->histLrt[i];
      }
      avgSquareHistLrt += self->histLrt[i] * binMid * binMid;
      avgHistLrtCompl += self->histLrt[i] * binMid;
    }
    if (numHistLrt > 0) {
      avgHistLrt = avgHistLrt / ((float)numHistLrt);
    }
    avgHistLrtCompl = avgHistLrtCompl / ((float)self->modelUpdatePars[1]);
    avgSquareHistLrt = avgSquareHistLrt / ((float)self->modelUpdatePars[1]);
    fluctLrt = avgSquareHistLrt - avgHistLrt * avgHistLrtCompl;
    // Get threshold for LRT feature.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      // Very low fluctuation, so likely noise.
      self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
    } else {
      self->priorModelPars[0] =
          self->featureExtractionParams.factor1ModelPars * avgHistLrt;
      // Check if value is within min/max range.
      if (self->priorModelPars[0] < self->featureExtractionParams.minLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.minLrt;
      }
      if (self->priorModelPars[0] > self->featureExtractionParams.maxLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
      }
    }
    // Done with LRT feature.

    // For spectral flatness and spectral difference: compute the main peaks of
    // histogram.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecFlat = 0.0;
    posPeak2SpecFlat = 0.0;
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;

    // Peaks for flatness.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          (i + 0.5f) * self->featureExtractionParams.binSizeSpecFlat;
      if (self->histSpecFlat[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        posPeak2SpecFlat = posPeak1SpecFlat;

        maxPeak1 = self->histSpecFlat[i];
        weightPeak1SpecFlat = self->histSpecFlat[i];
        posPeak1SpecFlat = binMid;
      } else if (self->histSpecFlat[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecFlat[i];
        weightPeak2SpecFlat = self->histSpecFlat[i];
        posPeak2SpecFlat = binMid;
      }
    }

    // Compute two peaks for spectral difference.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecDiff = 0.0;
    posPeak2SpecDiff = 0.0;
    weightPeak1SpecDiff = 0;
    weightPeak2SpecDiff = 0;
    // Peaks for spectral difference.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          ((float)i + 0.5f) * self->featureExtractionParams.binSizeSpecDiff;
      if (self->histSpecDiff[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecDiff = weightPeak1SpecDiff;
        posPeak2SpecDiff = posPeak1SpecDiff;

        maxPeak1 = self->histSpecDiff[i];
        weightPeak1SpecDiff = self->histSpecDiff[i];
        posPeak1SpecDiff = binMid;
      } else if (self->histSpecDiff[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecDiff[i];
        weightPeak2SpecDiff = self->histSpecDiff[i];
        posPeak2SpecDiff = binMid;
      }
    }

    // For spectrum flatness feature.
    useFeatureSpecFlat = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecFlat - posPeak1SpecFlat) <
         self->featureExtractionParams.limitPeakSpacingSpecFlat) &&
        (weightPeak2SpecFlat >
         self->featureExtractionParams.limitPeakWeightsSpecFlat *
             weightPeak1SpecFlat)) {
      weightPeak1SpecFlat += weightPeak2SpecFlat;
      posPeak1SpecFlat = 0.5f * (posPeak1SpecFlat + posPeak2SpecFlat);
    }
    // Reject if weight of peaks is not large enough, or peak value too small.
    if (weightPeak1SpecFlat <
            self->featureExtractionParams.thresWeightSpecFlat ||
        posPeak1SpecFlat < self->featureExtractionParams.thresPosSpecFlat) {
      useFeatureSpecFlat = 0;
    }
    // If selected, get the threshold.
    if (useFeatureSpecFlat == 1) {
      // Compute the threshold.
      self->priorModelPars[1] =
          self->featureExtractionParams.factor2ModelPars * posPeak1SpecFlat;
      // Check if value is within min/max range.
      if (self->priorModelPars[1] < self->featureExtractionParams.minSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.minSpecFlat;
      }
      if (self->priorModelPars[1] > self->featureExtractionParams.maxSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.maxSpecFlat;
      }
    }
    // Done with flatness feature.

    // For template feature.
    useFeatureSpecDiff = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecDiff - posPeak1SpecDiff) <
         self->featureExtractionParams.limitPeakSpacingSpecDiff) &&
        (weightPeak2SpecDiff >
         self->featureExtractionParams.limitPeakWeightsSpecDiff *
             weightPeak1SpecDiff)) {
      weightPeak1SpecDiff += weightPeak2SpecDiff;
      posPeak1SpecDiff = 0.5f * (posPeak1SpecDiff + posPeak2SpecDiff);
    }
    // Get the threshold value.
    self->priorModelPars[3] =
        self->featureExtractionParams.factor1ModelPars * posPeak1SpecDiff;
    // Reject if weight of peaks is not large enough.
    if (weightPeak1SpecDiff <
        self->featureExtractionParams.thresWeightSpecDiff) {
      useFeatureSpecDiff = 0;
    }
    // Check if value is within min/max range.
    if (self->priorModelPars[3] < self->featureExtractionParams.minSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.minSpecDiff;
    }
    if (self->priorModelPars[3] > self->featureExtractionParams.maxSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.maxSpecDiff;
    }
    // Done with spectral difference feature.

    // Don't use template feature if fluctuation of LRT feature is very low:
    // most likely just noise state.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      useFeatureSpecDiff = 0;
    }

    // Select the weights between the features.
    // self->priorModelPars[4] is weight for LRT: always selected.
    // self->priorModelPars[5] is weight for spectral flatness.
    // self->priorModelPars[6] is weight for spectral difference.
    featureSum = (float)(1 + useFeatureSpecFlat + useFeatureSpecDiff);
    self->priorModelPars[4] = 1.f / featureSum;
    self->priorModelPars[5] = ((float)useFeatureSpecFlat) / featureSum;
    self->priorModelPars[6] = ((float)useFeatureSpecDiff) / featureSum;

    // Set hists to zero for next update.
    if (self->modelUpdatePars[0] >= 1) {
      for (i = 0; i < HIST_PAR_EST; i++) {
        self->histLrt[i] = 0;
        self->histSpecFlat[i] = 0;
        self->histSpecDiff[i] = 0;
      }
    }
  }  // End of flag == 1.
}